

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CConvertVisitor.cpp
# Opt level: O0

void __thiscall CConvertVisitor::Visit(CConvertVisitor *this,CAssignSubscriptStm *stm)

{
  bool bVar1;
  pointer pCVar2;
  pointer pIVar3;
  CAssignSubscriptStm *stm_local;
  CConvertVisitor *this_local;
  
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&stm->idExpression);
  if (bVar1) {
    pCVar2 = std::unique_ptr<CIdExp,_std::default_delete<CIdExp>_>::operator->(&stm->idExpression);
    (**(pCVar2->super_IExpression).super_PositionedNode.super_INode._vptr_INode)(pCVar2,this);
  }
  std::__cxx11::string::operator+=((string *)&this->code,"[");
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&stm->indexExpression);
  if (bVar1) {
    pIVar3 = std::unique_ptr<IExpression,_std::default_delete<IExpression>_>::operator->
                       (&stm->indexExpression);
    (**(pIVar3->super_PositionedNode).super_INode._vptr_INode)(pIVar3,this);
  }
  std::__cxx11::string::operator+=((string *)&this->code,"] = ");
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&stm->valueExpression);
  if (bVar1) {
    pIVar3 = std::unique_ptr<IExpression,_std::default_delete<IExpression>_>::operator->
                       (&stm->valueExpression);
    (**(pIVar3->super_PositionedNode).super_INode._vptr_INode)(pIVar3,this);
  }
  std::__cxx11::string::operator+=((string *)&this->code,";\n");
  return;
}

Assistant:

void CConvertVisitor::Visit(CAssignSubscriptStm &stm) {
	if (stm.idExpression) {
		stm.idExpression->Accept(*this);
	}
	this->code += "[";
	if (stm.indexExpression) {
		stm.indexExpression->Accept(*this);
	}
	this->code += "] = ";
	if (stm.valueExpression) {
		stm.valueExpression->Accept(*this);
	}
	this->code += ";\n";
}